

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O1

void __thiscall
FIX44::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  int iVar1;
  FieldBase *pFVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  string *psVar3;
  
  pFVar2 = FIX::FieldMap::getFieldRef((FieldMap *)(message + 0x70),0x23);
  psVar3 = &pFVar2->m_string;
  iVar1 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar1 == 0) {
    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[4];
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[5];
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar1 == 0) {
        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[6];
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar1 == 0) {
          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[7];
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)psVar3);
          if (iVar1 == 0) {
            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[8];
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)psVar3);
            if (iVar1 == 0) {
              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[9];
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)psVar3);
              if (iVar1 == 0) {
                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[10];
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)psVar3);
                if (iVar1 == 0) {
                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xb];
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)psVar3);
                  if (iVar1 == 0) {
                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xc];
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)psVar3);
                    if (iVar1 == 0) {
                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xd];
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)psVar3);
                      if (iVar1 == 0) {
                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xe];
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)psVar3);
                        if (iVar1 == 0) {
                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0xf];
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)psVar3);
                          if (iVar1 == 0) {
                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x10];
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)psVar3);
                            if (iVar1 == 0) {
                              UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x11];
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)psVar3);
                              if (iVar1 == 0) {
                                UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x12];
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                if (iVar1 == 0) {
                                  UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x13];
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                  if (iVar1 == 0) {
                                    UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x14];
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                    if (iVar1 == 0) {
                                      UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x15];
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                      if (iVar1 == 0) {
                                        UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x16];
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                        if (iVar1 == 0) {
                                          UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x17];
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                          if (iVar1 == 0) {
                                            UNRECOVERED_JUMPTABLE = this->_vptr_MessageCracker[0x18]
                                            ;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                            if (iVar1 == 0) {
                                              UNRECOVERED_JUMPTABLE =
                                                   this->_vptr_MessageCracker[0x19];
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                              if (iVar1 == 0) {
                                                UNRECOVERED_JUMPTABLE =
                                                     this->_vptr_MessageCracker[0x1a];
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)psVar3);
                                                if (iVar1 == 0) {
                                                  UNRECOVERED_JUMPTABLE =
                                                       this->_vptr_MessageCracker[0x1b];
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)psVar3);
                                                  if (iVar1 == 0) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         this->_vptr_MessageCracker[0x1c];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x1d];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x1e];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x1f];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x20];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x21];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x22];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x23];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x24];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x25];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x26];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x27];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x28];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x29];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x2a];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x2b];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x2c];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x2d];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x2e];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x2f];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x30];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x31];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x32];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x33];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x34];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x35];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x36];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x37];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x38];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x39];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x3a];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x3b];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x3c];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x3d];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x3e];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x3f];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x40];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x41];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x42];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x43];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x44];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x45];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x46];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x47];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x48];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x49];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x4a];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x4b];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x4c];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x4d];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x4e];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x4f];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x50];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x51];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x52];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x53];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x54];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x55];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x56];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x57];
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     this->_vptr_MessageCracker
                                                                     [0x58];
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       this->_vptr_MessageCracker
                                                                       [0x59];
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         this->_vptr_MessageCracker
                                                                         [0x5a];
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           this->
                                                  _vptr_MessageCracker[0x5b];
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           this->_vptr_MessageCracker[0x5c];
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             this->_vptr_MessageCracker[0x5d];
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               this->_vptr_MessageCracker[0x5e];
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 this->_vptr_MessageCracker[0x5f];
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[0x60];
                                                            }
                                                            else {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   this->_vptr_MessageCracker[2];
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,message,sessionID);
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string& msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    if( msgTypeValue == "0" )
      onMessage( (const Heartbeat&)message, sessionID );
    else
    if( msgTypeValue == "1" )
      onMessage( (const TestRequest&)message, sessionID );
    else
    if( msgTypeValue == "2" )
      onMessage( (const ResendRequest&)message, sessionID );
    else
    if( msgTypeValue == "3" )
      onMessage( (const Reject&)message, sessionID );
    else
    if( msgTypeValue == "4" )
      onMessage( (const SequenceReset&)message, sessionID );
    else
    if( msgTypeValue == "5" )
      onMessage( (const Logout&)message, sessionID );
    else
    if( msgTypeValue == "6" )
      onMessage( (const IOI&)message, sessionID );
    else
    if( msgTypeValue == "7" )
      onMessage( (const Advertisement&)message, sessionID );
    else
    if( msgTypeValue == "8" )
      onMessage( (const ExecutionReport&)message, sessionID );
    else
    if( msgTypeValue == "9" )
      onMessage( (const OrderCancelReject&)message, sessionID );
    else
    if( msgTypeValue == "A" )
      onMessage( (const Logon&)message, sessionID );
    else
    if( msgTypeValue == "B" )
      onMessage( (const News&)message, sessionID );
    else
    if( msgTypeValue == "C" )
      onMessage( (const Email&)message, sessionID );
    else
    if( msgTypeValue == "D" )
      onMessage( (const NewOrderSingle&)message, sessionID );
    else
    if( msgTypeValue == "E" )
      onMessage( (const NewOrderList&)message, sessionID );
    else
    if( msgTypeValue == "F" )
      onMessage( (const OrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "G" )
      onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "H" )
      onMessage( (const OrderStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "J" )
      onMessage( (const AllocationInstruction&)message, sessionID );
    else
    if( msgTypeValue == "K" )
      onMessage( (const ListCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "L" )
      onMessage( (const ListExecute&)message, sessionID );
    else
    if( msgTypeValue == "M" )
      onMessage( (const ListStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "N" )
      onMessage( (const ListStatus&)message, sessionID );
    else
    if( msgTypeValue == "P" )
      onMessage( (const AllocationInstructionAck&)message, sessionID );
    else
    if( msgTypeValue == "Q" )
      onMessage( (const DontKnowTrade&)message, sessionID );
    else
    if( msgTypeValue == "R" )
      onMessage( (const QuoteRequest&)message, sessionID );
    else
    if( msgTypeValue == "S" )
      onMessage( (const Quote&)message, sessionID );
    else
    if( msgTypeValue == "T" )
      onMessage( (const SettlementInstructions&)message, sessionID );
    else
    if( msgTypeValue == "V" )
      onMessage( (const MarketDataRequest&)message, sessionID );
    else
    if( msgTypeValue == "W" )
      onMessage( (const MarketDataSnapshotFullRefresh&)message, sessionID );
    else
    if( msgTypeValue == "X" )
      onMessage( (const MarketDataIncrementalRefresh&)message, sessionID );
    else
    if( msgTypeValue == "Y" )
      onMessage( (const MarketDataRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "Z" )
      onMessage( (const QuoteCancel&)message, sessionID );
    else
    if( msgTypeValue == "a" )
      onMessage( (const QuoteStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "b" )
      onMessage( (const MassQuoteAcknowledgement&)message, sessionID );
    else
    if( msgTypeValue == "c" )
      onMessage( (const SecurityDefinitionRequest&)message, sessionID );
    else
    if( msgTypeValue == "d" )
      onMessage( (const SecurityDefinition&)message, sessionID );
    else
    if( msgTypeValue == "e" )
      onMessage( (const SecurityStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "f" )
      onMessage( (const SecurityStatus&)message, sessionID );
    else
    if( msgTypeValue == "g" )
      onMessage( (const TradingSessionStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "h" )
      onMessage( (const TradingSessionStatus&)message, sessionID );
    else
    if( msgTypeValue == "i" )
      onMessage( (const MassQuote&)message, sessionID );
    else
    if( msgTypeValue == "j" )
      onMessage( (const BusinessMessageReject&)message, sessionID );
    else
    if( msgTypeValue == "k" )
      onMessage( (const BidRequest&)message, sessionID );
    else
    if( msgTypeValue == "l" )
      onMessage( (const BidResponse&)message, sessionID );
    else
    if( msgTypeValue == "m" )
      onMessage( (const ListStrikePrice&)message, sessionID );
    else
    if( msgTypeValue == "n" )
      onMessage( (const XMLnonFIX&)message, sessionID );
    else
    if( msgTypeValue == "o" )
      onMessage( (const RegistrationInstructions&)message, sessionID );
    else
    if( msgTypeValue == "p" )
      onMessage( (const RegistrationInstructionsResponse&)message, sessionID );
    else
    if( msgTypeValue == "q" )
      onMessage( (const OrderMassCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "r" )
      onMessage( (const OrderMassCancelReport&)message, sessionID );
    else
    if( msgTypeValue == "s" )
      onMessage( (const NewOrderCross&)message, sessionID );
    else
    if( msgTypeValue == "t" )
      onMessage( (const CrossOrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "u" )
      onMessage( (const CrossOrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "v" )
      onMessage( (const SecurityTypeRequest&)message, sessionID );
    else
    if( msgTypeValue == "w" )
      onMessage( (const SecurityTypes&)message, sessionID );
    else
    if( msgTypeValue == "x" )
      onMessage( (const SecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "y" )
      onMessage( (const SecurityList&)message, sessionID );
    else
    if( msgTypeValue == "z" )
      onMessage( (const DerivativeSecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "AA" )
      onMessage( (const DerivativeSecurityList&)message, sessionID );
    else
    if( msgTypeValue == "AB" )
      onMessage( (const NewOrderMultileg&)message, sessionID );
    else
    if( msgTypeValue == "AC" )
      onMessage( (const MultilegOrderCancelReplace&)message, sessionID );
    else
    if( msgTypeValue == "AD" )
      onMessage( (const TradeCaptureReportRequest&)message, sessionID );
    else
    if( msgTypeValue == "AE" )
      onMessage( (const TradeCaptureReport&)message, sessionID );
    else
    if( msgTypeValue == "AF" )
      onMessage( (const OrderMassStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "AG" )
      onMessage( (const QuoteRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "AH" )
      onMessage( (const RFQRequest&)message, sessionID );
    else
    if( msgTypeValue == "AI" )
      onMessage( (const QuoteStatusReport&)message, sessionID );
    else
    if( msgTypeValue == "AJ" )
      onMessage( (const QuoteResponse&)message, sessionID );
    else
    if( msgTypeValue == "AK" )
      onMessage( (const Confirmation&)message, sessionID );
    else
    if( msgTypeValue == "AL" )
      onMessage( (const PositionMaintenanceRequest&)message, sessionID );
    else
    if( msgTypeValue == "AM" )
      onMessage( (const PositionMaintenanceReport&)message, sessionID );
    else
    if( msgTypeValue == "AN" )
      onMessage( (const RequestForPositions&)message, sessionID );
    else
    if( msgTypeValue == "AO" )
      onMessage( (const RequestForPositionsAck&)message, sessionID );
    else
    if( msgTypeValue == "AP" )
      onMessage( (const PositionReport&)message, sessionID );
    else
    if( msgTypeValue == "AQ" )
      onMessage( (const TradeCaptureReportRequestAck&)message, sessionID );
    else
    if( msgTypeValue == "AR" )
      onMessage( (const TradeCaptureReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AS" )
      onMessage( (const AllocationReport&)message, sessionID );
    else
    if( msgTypeValue == "AT" )
      onMessage( (const AllocationReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AU" )
      onMessage( (const ConfirmationAck&)message, sessionID );
    else
    if( msgTypeValue == "AV" )
      onMessage( (const SettlementInstructionRequest&)message, sessionID );
    else
    if( msgTypeValue == "AW" )
      onMessage( (const AssignmentReport&)message, sessionID );
    else
    if( msgTypeValue == "AX" )
      onMessage( (const CollateralRequest&)message, sessionID );
    else
    if( msgTypeValue == "AY" )
      onMessage( (const CollateralAssignment&)message, sessionID );
    else
    if( msgTypeValue == "AZ" )
      onMessage( (const CollateralResponse&)message, sessionID );
    else
    if( msgTypeValue == "BA" )
      onMessage( (const CollateralReport&)message, sessionID );
    else
    if( msgTypeValue == "BB" )
      onMessage( (const CollateralInquiry&)message, sessionID );
    else
    if( msgTypeValue == "BC" )
      onMessage( (const NetworkCounterpartySystemStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "BD" )
      onMessage( (const NetworkCounterpartySystemStatusResponse&)message, sessionID );
    else
    if( msgTypeValue == "BE" )
      onMessage( (const UserRequest&)message, sessionID );
    else
    if( msgTypeValue == "BF" )
      onMessage( (const UserResponse&)message, sessionID );
    else
    if( msgTypeValue == "BG" )
      onMessage( (const CollateralInquiryAck&)message, sessionID );
    else
    if( msgTypeValue == "BH" )
      onMessage( (const ConfirmationRequest&)message, sessionID );
    else onMessage( message, sessionID );
  }